

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O1

void __thiscall
tlx::CmdlineParser::Argument::Argument
          (Argument *this,char key,string *longkey,string *keytype,string *desc,bool required)

{
  pointer pcVar1;
  
  this->_vptr_Argument = (_func_int **)&PTR__Argument_00167898;
  this->key_ = key;
  (this->longkey_)._M_dataplus._M_p = (pointer)&(this->longkey_).field_2;
  pcVar1 = (longkey->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->longkey_,pcVar1,pcVar1 + longkey->_M_string_length);
  (this->keytype_)._M_dataplus._M_p = (pointer)&(this->keytype_).field_2;
  pcVar1 = (keytype->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->keytype_,pcVar1,pcVar1 + keytype->_M_string_length);
  (this->desc_)._M_dataplus._M_p = (pointer)&(this->desc_).field_2;
  pcVar1 = (desc->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->desc_,pcVar1,pcVar1 + desc->_M_string_length);
  this->required_ = required;
  this->found_ = false;
  this->repeated_ = false;
  return;
}

Assistant:

Argument(char key, const std::string& longkey, const std::string& keytype,
             const std::string& desc, bool required)
        : key_(key), longkey_(longkey), keytype_(keytype), desc_(desc),
          required_(required) { }